

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poisson.cpp
# Opt level: O3

void LoadDensityMap(char *FileName)

{
  size_t sVar1;
  byte *pbVar2;
  ostream *poVar3;
  float *pfVar4;
  int y;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  long lVar8;
  int H;
  int W;
  int local_30;
  int local_2c;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Loading density map ",0x14);
  if (FileName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10a168);
  }
  else {
    sVar1 = strlen(FileName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,FileName,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  pbVar2 = LoadBMP(FileName,&local_2c,&local_30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loaded ( ",9);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_2c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," x ",3);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ) ",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((local_2c == 0x200) && (local_30 == 0x200)) {
    pfVar4 = (float *)operator_new__(0x100000);
    lVar5 = 0;
    pbVar6 = pbVar2;
    g_DensityMap = pfVar4;
    do {
      lVar8 = 0;
      pbVar7 = pbVar6;
      do {
        pfVar4[lVar8] = (float)*pbVar7 / 255.0;
        lVar8 = lVar8 + 1;
        pbVar7 = pbVar7 + 3;
      } while (lVar8 != 0x200);
      lVar5 = lVar5 + 1;
      pfVar4 = pfVar4 + 0x200;
      pbVar6 = pbVar6 + 0x600;
    } while (lVar5 != 0x200);
    operator_delete__(pbVar2);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"ERROR: density map should be ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x200);
  poVar3 = std::operator<<(poVar3," x ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x200);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(0xff);
}

Assistant:

void LoadDensityMap(const char* FileName) {
  std::cout << "Loading density map " << FileName << std::endl;

  int W, H;
  unsigned char* Data = LoadBMP(FileName, &W, &H);

  std::cout << "Loaded ( " << W << " x " << H << " ) " << std::endl;

  if (W != kImageSize || H != kImageSize) {
    std::cout << "ERROR: density map should be " << kImageSize << " x " << kImageSize << std::endl;

    exit(255);
  }

  g_DensityMap = new float[W * H];

  for (int y = 0; y != H; y++) {
    for (int x = 0; x != W; x++) {
      g_DensityMap[x + y * W] = float(Data[3 * (x + y * W)]) / 255.0f;
    }
  }

  delete[] (Data);
}